

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::Handlers::beginDict(std::function<void(JSON)>,std::function<void()>)::$_1::
__1(__1 *this,anon_class_32_1_53ba67ea *param_1)

{
  anon_class_32_1_53ba67ea *param_1_local;
  anon_class_32_1_53ba67ea *this_local;
  
  std::function<void_()>::function((function<void_()> *)this,&param_1->end_fn);
  return;
}

Assistant:

void
Handlers::beginArray(json_handler_t start_fn, bare_handler_t end_fn)
{
    auto item_jh = std::make_shared<JSONHandler>();
    jh->addArrayHandlers(
        [start_fn](std::string const&, JSON j) { start_fn(j); },
        [end_fn](std::string const&) { end_fn(); },
        item_jh);
    jh->addFallbackHandler(item_jh);
    this->jh = item_jh.get();
    this->json_handlers.emplace_back(std::move(item_jh));
}